

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamMultiReader_p.cpp
# Opt level: O3

bool __thiscall
BamTools::Internal::BamMultiReaderPrivate::LocateIndexes
          (BamMultiReaderPrivate *this,IndexType *preferredType)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pMVar3;
  BamReader *this_00;
  pointer pcVar4;
  bool bVar5;
  long *plVar6;
  size_type *psVar7;
  MergeItem *item;
  pointer pMVar8;
  bool bVar9;
  string currentError;
  string message;
  string local_98;
  string local_78;
  IndexType *local_58;
  string local_50;
  
  (this->m_errorString)._M_string_length = 0;
  *(this->m_errorString)._M_dataplus._M_p = '\0';
  pMVar8 = (this->m_readers).
           super__Vector_base<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar3 = (this->m_readers).
           super__Vector_base<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar5 = true;
  if (pMVar8 != pMVar3) {
    psVar1 = &this->m_errorString;
    bVar9 = false;
    local_58 = preferredType;
    do {
      this_00 = pMVar8->Reader;
      if (this_00 != (BamReader *)0x0) {
        bVar5 = BamReader::HasIndex(this_00);
        if (!bVar5) {
          bVar5 = BamReader::LocateIndex(this_00,local_58);
          if (!bVar5) {
            std::__cxx11::string::_M_replace_aux
                      ((ulong)psVar1,(this->m_errorString)._M_string_length,0,'\x01');
            BamReader::GetErrorString_abi_cxx11_(&local_98,this_00);
            std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_98._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p);
            }
            std::__cxx11::string::_M_replace_aux
                      ((ulong)psVar1,(this->m_errorString)._M_string_length,0,'\x01');
            bVar9 = true;
          }
        }
      }
      pMVar8 = pMVar8 + 1;
    } while (pMVar8 != pMVar3);
    bVar5 = true;
    if (bVar9) {
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      pcVar4 = (this->m_errorString)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,pcVar4,pcVar4 + (this->m_errorString)._M_string_length);
      paVar2 = &local_78.field_2;
      local_78._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,"error while locating index files: \n","");
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_78,(ulong)local_98._M_dataplus._M_p);
      psVar7 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_50.field_2._M_allocated_capacity = *psVar7;
        local_50.field_2._8_8_ = plVar6[3];
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      }
      else {
        local_50.field_2._M_allocated_capacity = *psVar7;
        local_50._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_50._M_string_length = plVar6[1];
      *plVar6 = (long)psVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      local_78._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,"BamMultiReader::LocatingIndexes","");
      SetErrorString(this,&local_78,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      bVar5 = false;
    }
  }
  return bVar5;
}

Assistant:

bool BamMultiReaderPrivate::LocateIndexes(const BamIndex::IndexType& preferredType)
{

    bool errorsEncountered = false;
    m_errorString.clear();

    // iterate over readers
    std::vector<MergeItem>::iterator readerIter = m_readers.begin();
    std::vector<MergeItem>::iterator readerEnd = m_readers.end();
    for (; readerIter != readerEnd; ++readerIter) {
        MergeItem& item = (*readerIter);
        BamReader* reader = item.Reader;
        if (reader == 0) {
            continue;
        }

        // if reader has no index, try to locate one
        if (!reader->HasIndex()) {
            if (!reader->LocateIndex(preferredType)) {
                m_errorString.append(1, '\t');
                m_errorString.append(reader->GetErrorString());
                m_errorString.append(1, '\n');
                errorsEncountered = true;
            }
        }
    }

    // check for errors encountered before returning success/fail
    if (errorsEncountered) {
        const std::string currentError = m_errorString;
        const std::string message =
            std::string("error while locating index files: \n") + currentError;
        SetErrorString("BamMultiReader::LocatingIndexes", message);
        return false;
    } else {
        return true;
    }
}